

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.hpp
# Opt level: O2

PivotRef * __thiscall duckdb::TableRef::Cast<duckdb::PivotRef>(TableRef *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == PIVOT) {
    return (PivotRef *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast constraint to type - constraint type mismatch",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const TARGET &Cast() const {
		if (type != TARGET::TYPE && TARGET::TYPE != TableReferenceType::INVALID) {
			throw InternalException("Failed to cast constraint to type - constraint type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}